

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall
testing::internal::anon_unknown_36::UnitTestFilter::MatchesName(UnitTestFilter *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  const_iterator cVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  string *local_38;
  
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->exact_match_patterns_)._M_h,name);
  if (cVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    return true;
  }
  __it._M_current =
       (this->glob_patterns_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->glob_patterns_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)__it._M_current >> 7;
  __it_00._M_current = __it._M_current;
  local_38 = name;
  if (0 < lVar4) {
    __it_00._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&((__it._M_current)->_M_dataplus)._M_p +
         ((long)pbVar1 - (long)__it._M_current & 0xffffffffffffff80U));
    lVar4 = lVar4 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                            *)&local_38,__it);
      _Var5._M_current = __it._M_current;
      if (bVar2) goto LAB_0015b88f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                            *)&local_38,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0015b88f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                            *)&local_38,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0015b88f;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
              ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                            *)&local_38,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0015b88f;
      __it._M_current = __it._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)pbVar1 - (long)__it_00._M_current >> 5;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var5._M_current = pbVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
                  ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                                *)&local_38,__it_00), _Var5._M_current = __it_00._M_current, bVar2))
      goto LAB_0015b88f;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
            ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                          *)&local_38,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (bVar2) goto LAB_0015b88f;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::{lambda(std::__cxx11::string_const&)#1}>
          ::operator()((_Iter_pred<testing::internal::(anonymous_namespace)::UnitTestFilter::MatchesName(std::__cxx11::string_const&)const::_lambda(std::__cxx11::string_const&)_1_>
                        *)&local_38,__it_00);
  _Var5._M_current = __it_00._M_current;
  if (!bVar2) {
    _Var5._M_current = pbVar1;
  }
LAB_0015b88f:
  return _Var5._M_current != pbVar1;
}

Assistant:

bool MatchesName(const std::string& name) const {
    return exact_match_patterns_.count(name) > 0 ||
           std::any_of(glob_patterns_.begin(), glob_patterns_.end(),
                       [&name](const std::string& pattern) {
                         return PatternMatchesString(
                             name, pattern.c_str(),
                             pattern.c_str() + pattern.size());
                       });
  }